

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_gamma.c
# Opt level: O0

float ToLinearBt1361(float gamma)

{
  float in_XMM0_Da;
  undefined4 local_4;
  
  if (-0.25 <= in_XMM0_Da) {
    if (0.0 <= in_XMM0_Da) {
      if (0.08124286 <= in_XMM0_Da) {
        if (1.0 <= in_XMM0_Da) {
          local_4 = 1.0;
        }
        else {
          local_4 = Powf(0.0,2.419326e-39);
        }
      }
      else {
        local_4 = in_XMM0_Da / 4.5;
      }
    }
    else {
      local_4 = Powf(0.0,2.419171e-39);
      local_4 = local_4 / -4.0;
    }
  }
  else {
    local_4 = -0.25;
  }
  return local_4;
}

Assistant:

static float ToLinearBt1361(float gamma) {
  if (gamma < -0.25f) {
    return -0.25f;
  } else if (gamma < 0.f) {
    return Powf((gamma - 0.02482420670236f) / -0.27482420670236f, 1.f / 0.45f) /
           -4.f;
  } else if (gamma < 4.5f * 0.018053968510807f) {
    return gamma / 4.5f;
  } else if (gamma < 1.f) {
    return Powf((gamma + 0.09929682680944f) / 1.09929682680944f, 1.f / 0.45f);
  }
  return 1.f;
}